

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O2

double psi(double *xx)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double local_10;
  
  iVar1 = ipmpar(&psi::K1);
  dVar5 = (double)iVar1;
  psi::xmax1 = dVar5;
  dVar6 = spmpar(&psi::K2);
  psi::xmax1 = dVar5;
  if (1.0 / dVar6 <= dVar5) {
    psi::xmax1 = 1.0 / dVar6;
  }
  psi::x = *xx;
  dVar5 = 0.0;
  if (psi::x < 0.5) {
    if (ABS(psi::x) <= 1e-09) {
      if ((psi::x == 0.0) && (!NAN(psi::x))) {
        return 0.0;
      }
      dVar5 = -1.0 / psi::x;
    }
    else {
      dVar5 = -psi::x;
      if (-psi::x <= psi::x) {
        dVar5 = psi::x;
      }
      if (psi::xmax1 <= dVar5) {
        return 0.0;
      }
      dVar5 = dVar5 - (double)(~-(ulong)(dVar5 < 1.0) & (ulong)(double)(int)(long)dVar5);
      dVar6 = dVar5 * 4.0;
      iVar1 = (int)(long)dVar6;
      if (dVar6 < 1.0) {
        iVar1 = 0;
      }
      dVar5 = ((double)iVar1 * -0.25 + dVar5) * 4.0;
      iVar4 = iVar1 + 1;
      if ((iVar1 / 2) * 2 != iVar1) {
        dVar5 = 1.0 - dVar5;
      }
      psi::z = dVar5 * 0.785398163397448;
      dVar5 = *(double *)(&DAT_00112c80 + (ulong)(psi::x < 0.0) * 8);
      iVar4 = -(uint)(((int)(((uint)(iVar4 >> 0x1f) >> 0x1e) + iVar4) >> 2) * 2 == iVar4 / 2);
      iVar1 = -(uint)(((int)(((uint)(iVar1 >> 0x1f) >> 0x1e) + iVar1) >> 2) * 2 == iVar1 / 2);
      auVar9._4_4_ = iVar4;
      auVar9._0_4_ = iVar4;
      auVar9._8_4_ = iVar1;
      auVar9._12_4_ = iVar1;
      uVar2 = movmskpd((uint)(psi::x < 0.0),auVar9);
      if ((uVar2 & 2) == 0) {
        dVar5 = -dVar5;
      }
      if ((uVar2 & 1) == 0) {
        local_10 = sin(psi::z);
        dVar6 = cos(psi::z);
      }
      else {
        if ((psi::z == 0.0) && (!NAN(psi::z))) {
          return 0.0;
        }
        local_10 = cos(psi::z);
        dVar6 = sin(psi::z);
      }
      dVar5 = dVar5 * (local_10 / dVar6) * 4.0;
    }
    psi::x = 1.0 - psi::x;
  }
  if (psi::x <= 3.0) {
    dVar7 = 0.0089538502298197;
    dVar6 = psi::x;
    for (lVar3 = 0; lVar3 != 0x28; lVar3 = lVar3 + 8) {
      dVar6 = (dVar6 + *(double *)((long)psi::q1 + lVar3)) * psi::x;
      dVar7 = dVar7 * psi::x + *(double *)((long)psi::p1 + lVar3 + 8);
    }
    dVar6 = (psi::x + -1.4616321449683622) *
            ((dVar7 * psi::x + 1305.60269827897) / (dVar6 + 6.91091682714533e-06)) + dVar5;
  }
  else {
    if (psi::x < psi::xmax1) {
      dVar11 = 1.0 / (psi::x * psi::x);
      dVar7 = -2.12940445131011;
      dVar6 = dVar11;
      for (lVar3 = 0; auVar8._0_8_ = dVar7 * dVar11, lVar3 != 0x18; lVar3 = lVar3 + 8) {
        dVar6 = (dVar6 + *(double *)((long)psi::q2 + lVar3)) * dVar11;
        dVar7 = auVar8._0_8_ + *(double *)((long)psi::p2 + lVar3 + 8);
      }
      auVar10._0_8_ = dVar6 + 7.77788548522962;
      auVar8._8_8_ = 0x3fe0000000000000;
      auVar10._8_8_ = psi::x;
      auVar9 = divpd(auVar8,auVar10);
      dVar5 = dVar5 + (auVar9._0_8_ - auVar9._8_8_);
    }
    dVar6 = log(psi::x);
    dVar6 = dVar6 + dVar5;
  }
  return dVar6;
}

Assistant:

double psi(double *xx)
/*
---------------------------------------------------------------------

                 EVALUATION OF THE DIGAMMA FUNCTION

                           -----------

     PSI(XX) IS ASSIGNED THE VALUE 0 WHEN THE DIGAMMA FUNCTION CANNOT
     BE COMPUTED.

     THE MAIN COMPUTATION INVOLVES EVALUATION OF RATIONAL CHEBYSHEV
     APPROXIMATIONS PUBLISHED IN MATH. COMP. 27, 123-127(1973) BY
     CODY, STRECOK AND THACHER.

---------------------------------------------------------------------
     PSI WAS WRITTEN AT ARGONNE NATIONAL LABORATORY FOR THE FUNPACK
     PACKAGE OF SPECIAL FUNCTION SUBROUTINES. PSI WAS MODIFIED BY
     A.H. MORRIS (NSWC).
---------------------------------------------------------------------
*/
{
static double dx0 = 1.461632144968362341262659542325721325e0;
static double piov4 = .785398163397448e0;
static double p1[7] = {
    .895385022981970e-02,.477762828042627e+01,.142441585084029e+03,
    .118645200713425e+04,.363351846806499e+04,.413810161269013e+04,
    .130560269827897e+04
};
static double p2[4] = {
    -.212940445131011e+01,-.701677227766759e+01,-.448616543918019e+01,
    -.648157123766197e+00
};
static double q1[6] = {
    .448452573429826e+02,.520752771467162e+03,.221000799247830e+04,
    .364127349079381e+04,.190831076596300e+04,.691091682714533e-05
};
static double q2[4] = {
    .322703493791143e+02,.892920700481861e+02,.546117738103215e+02,
    .777788548522962e+01
};
static int K1 = 3;
static int K2 = 1;
static double psi,aug,den,sgn,upper,w,x,xmax1,xmx0,xsmall,z;
static int i,m,n,nq;
/*
     ..
     .. Executable Statements ..
*/
/*
---------------------------------------------------------------------
     MACHINE DEPENDENT CONSTANTS ...
        XMAX1  = THE SMALLEST POSITIVE FLOATING POINT CONSTANT
                 WITH ENTIRELY INTEGER REPRESENTATION.  ALSO USED
                 AS NEGATIVE OF LOWER BOUND ON ACCEPTABLE NEGATIVE
                 ARGUMENTS AND AS THE POSITIVE ARGUMENT BEYOND WHICH
                 PSI MAY BE REPRESENTED AS ALOG(X).
        XSMALL = ABSOLUTE ARGUMENT BELOW WHICH PI*COTAN(PI*X)
                 MAY BE REPRESENTED BY 1/X.
---------------------------------------------------------------------
*/
    xmax1 = ipmpar(&K1);
    xmax1 = fifdmin1(xmax1,1.0e0/spmpar(&K2));
    xsmall = 1.e-9;
    x = *xx;
    aug = 0.0e0;
    if(x >= 0.5e0) goto S50;
/*
---------------------------------------------------------------------
     X .LT. 0.5,  USE REFLECTION FORMULA
     PSI(1-X) = PSI(X) + PI * COTAN(PI*X)
---------------------------------------------------------------------
*/
    if(fabs(x) > xsmall) goto S10;
    if(x == 0.0e0) goto S100;
/*
---------------------------------------------------------------------
     0 .LT. ABS(X) .LE. XSMALL.  USE 1/X AS A SUBSTITUTE
     FOR  PI*COTAN(PI*X)
---------------------------------------------------------------------
*/
    aug = -(1.0e0/x);
    goto S40;
S10:
/*
---------------------------------------------------------------------
     REDUCTION OF ARGUMENT FOR COTAN
---------------------------------------------------------------------
*/
    w = -x;
    sgn = piov4;
    if(w > 0.0e0) goto S20;
    w = -w;
    sgn = -sgn;
S20:
/*
---------------------------------------------------------------------
     MAKE AN ERROR EXIT IF X .LE. -XMAX1
---------------------------------------------------------------------
*/
    if(w >= xmax1) goto S100;
    nq = fifidint(w);
    w -= (double)nq;
    nq = fifidint(w*4.0e0);
    w = 4.0e0*(w-(double)nq*.25e0);
/*
---------------------------------------------------------------------
     W IS NOW RELATED TO THE FRACTIONAL PART OF  4.0 * X.
     ADJUST ARGUMENT TO CORRESPOND TO VALUES IN FIRST
     QUADRANT AND DETERMINE SIGN
---------------------------------------------------------------------
*/
    n = nq/2;
    if(n+n != nq) w = 1.0e0-w;
    z = piov4*w;
    m = n/2;
    if(m+m != n) sgn = -sgn;
/*
---------------------------------------------------------------------
     DETERMINE FINAL VALUE FOR  -PI*COTAN(PI*X)
---------------------------------------------------------------------
*/
    n = (nq+1)/2;
    m = n/2;
    m += m;
    if(m != n) goto S30;
/*
---------------------------------------------------------------------
     CHECK FOR SINGULARITY
---------------------------------------------------------------------
*/
    if(z == 0.0e0) goto S100;
/*
---------------------------------------------------------------------
     USE COS/SIN AS A SUBSTITUTE FOR COTAN, AND
     SIN/COS AS A SUBSTITUTE FOR TAN
---------------------------------------------------------------------
*/
    aug = sgn*(cos(z)/sin(z)*4.0e0);
    goto S40;
S30:
    aug = sgn*(sin(z)/cos(z)*4.0e0);
S40:
    x = 1.0e0-x;
S50:
    if(x > 3.0e0) goto S70;
/*
---------------------------------------------------------------------
     0.5 .LE. X .LE. 3.0
---------------------------------------------------------------------
*/
    den = x;
    upper = p1[0]*x;
    for(i=1; i<=5; i++) {
        den = (den+q1[i-1])*x;
        upper = (upper+p1[i+1-1])*x;
    }
    den = (upper+p1[6])/(den+q1[5]);
    xmx0 = x-dx0;
    psi = den*xmx0+aug;
    return psi;
S70:
/*
---------------------------------------------------------------------
     IF X .GE. XMAX1, PSI = LN(X)
---------------------------------------------------------------------
*/
    if(x >= xmax1) goto S90;
/*
---------------------------------------------------------------------
     3.0 .LT. X .LT. XMAX1
---------------------------------------------------------------------
*/
    w = 1.0e0/(x*x);
    den = w;
    upper = p2[0]*w;
    for(i=1; i<=3; i++) {
        den = (den+q2[i-1])*w;
        upper = (upper+p2[i+1-1])*w;
    }
    aug = upper/(den+q2[3])-0.5e0/x+aug;
S90:
    psi = aug+log(x);
    return psi;
S100:
/*
---------------------------------------------------------------------
     ERROR RETURN
---------------------------------------------------------------------
*/
    psi = 0.0e0;
    return psi;
}